

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O3

void __thiscall zmq::msg_t::add_refs(msg_t *this,int refs_)

{
  uchar *puVar1;
  uchar uVar2;
  atomic_counter_t *paVar3;
  
  if (refs_ < 0) {
    add_refs();
  }
  if ((this->_u).base.metadata != (metadata_t *)0x0) {
    add_refs();
  }
  if ((refs_ != 0) && ((uVar2 = (this->_u).base.type, uVar2 == 'i' || (uVar2 == 'f')))) {
    uVar2 = (this->_u).base.flags;
    paVar3 = refcnt(this);
    if ((char)uVar2 < '\0') {
      LOCK();
      (paVar3->_value).super___atomic_base<unsigned_int>._M_i =
           (paVar3->_value).super___atomic_base<unsigned_int>._M_i + refs_;
      UNLOCK();
    }
    else {
      LOCK();
      (paVar3->_value).super___atomic_base<unsigned_int>._M_i = refs_ + 1;
      UNLOCK();
      puVar1 = &(this->_u).base.flags;
      *puVar1 = *puVar1 | 0x80;
    }
  }
  return;
}

Assistant:

void zmq::msg_t::add_refs (int refs_)
{
    zmq_assert (refs_ >= 0);

    //  Operation not supported for messages with metadata.
    zmq_assert (_u.base.metadata == NULL);

    //  No copies required.
    if (!refs_)
        return;

    //  VSMs, CMSGS and delimiters can be copied straight away. The only
    //  message type that needs special care are long messages.
    if (_u.base.type == type_lmsg || is_zcmsg ()) {
        if (_u.base.flags & msg_t::shared)
            refcnt ()->add (refs_);
        else {
            refcnt ()->set (refs_ + 1);
            _u.base.flags |= msg_t::shared;
        }
    }
}